

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O0

void jsoncons::jsonpointer::
     remove<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
               basic_json_pointer<char> *location,error_code *ec)

{
  ulong uVar1;
  bool bVar2;
  reference pbVar3;
  long lVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this;
  size_t sVar5;
  error_code *in_RDX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  undefined1 auVar6 [16];
  type tVar7;
  type result;
  size_t index;
  iterator end;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *current;
  basic_json_pointer<char> *in_stack_fffffffffffffe98;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffea0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  jsonpointer_errc __e;
  error_code *in_stack_fffffffffffffeb0;
  string_view_type *in_stack_fffffffffffffeb8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  string_view_type *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  const_array_iterator in_stack_fffffffffffffef8;
  error_code *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  string_view_type *in_stack_ffffffffffffff30;
  iterator in_stack_ffffffffffffff38;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_90;
  to_integer_errc local_88;
  ulong local_80;
  undefined4 local_74;
  undefined1 local_70 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  string local_40 [32];
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_20;
  error_code *local_18;
  
  local_20 = in_RDI;
  local_18 = in_RDX;
  std::__cxx11::string::string(local_40);
  local_48._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       basic_json_pointer<char>::begin_abi_cxx11_(in_stack_fffffffffffffe98);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             basic_json_pointer<char>::end_abi_cxx11_(in_stack_fffffffffffffe98);
  do {
    do {
      bVar2 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffea0,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffe98);
      if (!bVar2) {
        bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           in_stack_fffffffffffffeb8);
        if (bVar2) {
          lVar4 = std::__cxx11::string::size();
          if (lVar4 == 1) {
            in_stack_fffffffffffffef8._M_current =
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 std::__cxx11::string::operator[]((ulong)local_40);
            if (*(char *)&(in_stack_fffffffffffffef8._M_current)->field_0 == '-') {
              std::error_code::operator=
                        (in_stack_fffffffffffffeb0,
                         (jsonpointer_errc)((ulong)in_stack_fffffffffffffea8 >> 0x20));
              local_74 = 1;
              goto LAB_00540b5d;
            }
          }
          local_80 = 0;
          std::__cxx11::string::data();
          std::__cxx11::string::length();
          tVar7 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                            ((char *)in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8,
                             (unsigned_long *)in_stack_fffffffffffffeb0);
          this = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)tVar7.ptr;
          local_88 = tVar7.ec;
          local_90 = this;
          bVar2 = jsoncons::detail::to_integer_result::operator_cast_to_bool
                            ((to_integer_result *)&local_90);
          uVar1 = local_80;
          if (!bVar2) {
            std::error_code::operator=
                      (in_stack_fffffffffffffeb0,
                       (jsonpointer_errc)((ulong)in_stack_fffffffffffffea8 >> 0x20));
            local_74 = 1;
            goto LAB_00540b5d;
          }
          sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                            (in_stack_fffffffffffffea8);
          if (sVar5 <= uVar1) {
            std::error_code::operator=
                      (in_stack_fffffffffffffeb0,
                       (jsonpointer_errc)((ulong)in_stack_fffffffffffffea8 >> 0x20));
            local_74 = 1;
            goto LAB_00540b5d;
          }
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(this);
          range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
          ::begin((range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                   *)&stack0xffffffffffffff38);
          __gnu_cxx::
          __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::operator+((__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffea8,(difference_type)in_stack_fffffffffffffea0);
          __gnu_cxx::
          __normal_iterator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*,std::vector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
          ::
          __normal_iterator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>*>
                    ((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffea0,
                     (__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffe98);
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::erase
                    (this,in_stack_fffffffffffffef8);
        }
        else {
          bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             in_stack_fffffffffffffeb8);
          __e = (jsonpointer_errc)((ulong)in_stack_fffffffffffffea8 >> 0x20);
          if (!bVar2) {
            std::error_code::operator=(in_stack_fffffffffffffeb0,__e);
            local_74 = 1;
            goto LAB_00540b5d;
          }
          std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
          bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                             in_stack_fffffffffffffee0);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            std::error_code::operator=(in_stack_fffffffffffffeb0,__e);
            local_74 = 1;
            goto LAB_00540b5d;
          }
          std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::erase
                    (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        }
        local_74 = 0;
        goto LAB_00540b5d;
      }
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_48);
      std::__cxx11::string::operator=(local_40,(string *)pbVar3);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_48);
      bVar2 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffea0,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffe98);
    } while (!bVar2);
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
    local_70 = auVar6;
    local_20 = detail::
               resolve<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                         (in_stack_ffffffffffffff38._M_current,in_stack_ffffffffffffff30,
                          SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0),
                          in_stack_ffffffffffffff20);
    bVar2 = std::error_code::operator_cast_to_bool(local_18);
  } while (!bVar2);
  local_74 = 1;
LAB_00540b5d:
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void remove(Json& root, const basic_json_pointer<typename Json::char_type>& location, std::error_code& ec)
    {
        Json* current = std::addressof(root);

        std::basic_string<typename Json::char_type> buffer;
        auto it = location.begin();
        auto end = location.end();

        while (it != end)
        {
            buffer = *it;
            ++it;
            if (it != end)
            {
                current = jsoncons::jsonpointer::detail::resolve(current, buffer, false, ec);
                if (JSONCONS_UNLIKELY(ec))
                    return;
            }
        }
        if (current->is_array())
        {
            if (buffer.size() == 1 && buffer[0] == '-')
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return;
            }
            else
            {
                std::size_t index{0};
                auto result = jsoncons::detail::dec_to_integer(buffer.data(), buffer.length(), index);
                if (!result)
                {
                    ec = jsonpointer_errc::invalid_index;
                    return;
                }
                if (index >= current->size())
                {
                    ec = jsonpointer_errc::index_exceeds_array_size;
                    return;
                }
                current->erase(current->array_range().begin()+index);
            }
        }
        else if (current->is_object())
        {
            if (!current->contains(buffer))
            {
                ec = jsonpointer_errc::key_not_found;
                return;
            }
            else
            {
                current->erase(buffer);
            }
        }
        else
        {
            ec = jsonpointer_errc::expected_object_or_array;
            return;
        }
    }